

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-model.h
# Opt level: O2

void __thiscall mp::NLSolution::NLSolution(NLSolution *this)

{
  _Rb_tree_header *p_Var1;
  
  this->solve_result_ = -2;
  this->nbs_ = 0;
  (this->solve_message_)._M_dataplus._M_p = (pointer)&(this->solve_message_).field_2;
  (this->solve_message_)._M_string_length = 0;
  (this->solve_message_).field_2._M_local_buf[0] = '\0';
  (this->suffixes_).super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>.
  _M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->suffixes_).
            super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>._M_t.
            _M_impl.super__Rb_tree_header;
  (this->suffixes_).super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>.
  _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->obj_val_ = 0.0;
  (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->suffixes_).super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>.
  _M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->suffixes_).super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>.
  _M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->suffixes_).super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>.
  _M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

operator bool() const { return solve_result_ > -2; }